

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall kj::Arena::cleanup(Arena *this,EVP_PKEY_CTX *ctx)

{
  ObjectHeader *pOVar1;
  _func_void_void_ptr *p_Var2;
  ChunkHeader *pCVar3;
  void *ptr_1;
  _func_void_void_ptr *destructor;
  void *ptr;
  Arena *this_local;
  
  while (this->objectList != (ObjectHeader *)0x0) {
    pOVar1 = this->objectList;
    p_Var2 = this->objectList->destructor;
    this->objectList = this->objectList->next;
    (*p_Var2)(pOVar1 + 1);
  }
  while (this->chunkList != (ChunkHeader *)0x0) {
    pCVar3 = this->chunkList;
    this->chunkList = this->chunkList->next;
    operator_delete(pCVar3);
  }
  return;
}

Assistant:

void Arena::cleanup() {
  while (objectList != nullptr) {
    void* ptr = objectList + 1;
    auto destructor = objectList->destructor;
    objectList = objectList->next;
    destructor(ptr);
  }

  while (chunkList != nullptr) {
    void* ptr = chunkList;
    chunkList = chunkList->next;
    operator delete(ptr);
  }
}